

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

int __thiscall State::inPlace(State *this)

{
  int iVar1;
  int expected;
  int value;
  int j;
  int i;
  int score;
  State *this_local;
  
  j = 0;
  for (value = 0; value < this->height; value = value + 1) {
    for (expected = 0; expected < this->width; expected = expected + 1) {
      iVar1 = value * this->width + 1 + expected;
      if ((this->tiles[value][expected] == iVar1) || (iVar1 == this->size)) {
        j = j + 1;
      }
    }
  }
  return j;
}

Assistant:

int State::inPlace() {
    int score = 0;
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int value = tiles[i][j];
            int expected = 1 + i * width + j;
            if (value == expected || expected == size)
                score++;
        }
    }
    return score;
}